

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

bool __thiscall
crnlib::
hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
::insert_no_grow(hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
                 *this,insert_result *result,vec<6U,_float> *k,uint *v)

{
  ulong uVar1;
  long lVar2;
  float fVar3;
  raw_node *prVar4;
  uint uVar5;
  undefined8 uVar6;
  long lVar7;
  bool bVar8;
  uint32 uVar9;
  raw_node *prVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar9 = fast_hash(k,0x18);
  uVar11 = uVar9 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
  prVar4 = (this->m_values).m_p;
  prVar10 = prVar4 + uVar11;
  uVar12 = uVar11;
  if (prVar4[uVar11].m_bits[0x1c] != '\0') {
    fVar3 = k->m_s[0];
    if ((*(float *)prVar10->m_bits == fVar3) && (!NAN(*(float *)prVar10->m_bits) && !NAN(fVar3))) {
      uVar13 = 0xffffffffffffffff;
      do {
        if (uVar13 == 4) goto LAB_0018d46a;
        lVar2 = uVar13 * 4;
        uVar1 = uVar13 + 1;
        lVar7 = uVar13 + 2;
      } while ((*(float *)(prVar4[uVar11].m_bits + lVar2 + 8) == k->m_s[lVar7]) &&
              (uVar13 = uVar1,
              !NAN(*(float *)(prVar4[uVar11].m_bits + lVar2 + 8)) && !NAN(k->m_s[lVar7])));
      if (4 < uVar1) {
LAB_0018d46a:
        bVar8 = false;
        goto LAB_0018d525;
      }
    }
    uVar14 = (this->m_values).m_size - 1;
    uVar13 = (ulong)(uVar11 - 1);
    if (uVar11 == 0) {
      uVar13 = (ulong)uVar14;
    }
    if (uVar11 == (uint)uVar13) {
      return false;
    }
    prVar10 = prVar10 + -1;
    if (uVar11 == 0) {
      prVar10 = prVar4 + uVar14;
    }
    while (uVar12 = (uint)uVar13, prVar10->m_bits[0x1c] != '\0') {
      if ((*(float *)prVar10->m_bits == fVar3) && (!NAN(*(float *)prVar10->m_bits) && !NAN(fVar3)))
      {
        uVar13 = 0xffffffffffffffff;
        do {
          if (uVar13 == 4) goto LAB_0018d4f2;
          lVar7 = uVar13 * 4;
          uVar1 = uVar13 + 1;
          lVar2 = uVar13 + 2;
        } while ((*(float *)(prVar10->m_bits + lVar7 + 8) == k->m_s[lVar2]) &&
                (uVar13 = uVar1,
                !NAN(*(float *)(prVar10->m_bits + lVar7 + 8)) && !NAN(k->m_s[lVar2])));
        if (4 < uVar1) {
LAB_0018d4f2:
          bVar8 = false;
          goto LAB_0018d525;
        }
      }
      uVar5 = uVar12 - 1;
      if (uVar12 == 0) {
        uVar5 = uVar14;
      }
      uVar13 = (ulong)uVar5;
      prVar10 = prVar10 + -1;
      if (uVar12 == 0) {
        prVar10 = prVar4 + uVar14;
      }
      if (uVar11 == uVar5) {
        return false;
      }
    }
  }
  if (this->m_grow_threshold <= this->m_num_valid) {
    return false;
  }
  *(undefined8 *)(prVar10->m_bits + 0x10) = *(undefined8 *)(k->m_s + 4);
  uVar6 = *(undefined8 *)(k->m_s + 2);
  *(undefined8 *)prVar10->m_bits = *(undefined8 *)k->m_s;
  *(undefined8 *)(prVar10->m_bits + 8) = uVar6;
  *(uint *)(prVar10->m_bits + 0x18) = *v;
  prVar10->m_bits[0x1c] = '\x01';
  this->m_num_valid = this->m_num_valid + 1;
  bVar8 = true;
LAB_0018d525:
  (result->first).m_pTable = this;
  (result->first).m_index = uVar12;
  result->second = bVar8;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value()) {
    if (!m_values.size())
      return false;

    int index = hash_key(k);
    node* pNode = &get_node(index);

    if (pNode->state) {
      if (m_equals(pNode->first, k)) {
        result.first = iterator(*this, index);
        result.second = false;
        return true;
      }

      const int orig_index = index;

      for (;;) {
        if (!index) {
          index = m_values.size() - 1;
          pNode = &get_node(index);
        } else {
          index--;
          pNode--;
        }

        if (orig_index == index)
          return false;

        if (!pNode->state)
          break;

        if (m_equals(pNode->first, k)) {
          result.first = iterator(*this, index);
          result.second = false;
          return true;
        }
      }
    }

    if (m_num_valid >= m_grow_threshold)
      return false;

    construct_value_type(pNode, k, v);

    pNode->state = cStateValid;

    m_num_valid++;
    CRNLIB_ASSERT(m_num_valid <= m_values.size());

    result.first = iterator(*this, index);
    result.second = true;

    return true;
  }